

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evol.c
# Opt level: O2

void * FFScreate_compat_info(FMFormat_conflict prior_format,char *xform_code,size_t *len_p)

{
  size_t sVar1;
  void *__dest;
  long lVar2;
  size_t s;
  
  sVar1 = strlen(xform_code);
  s = sVar1 + (long)(prior_format->server_ID).length + 1;
  __dest = ffs_malloc(s);
  memcpy(__dest,(prior_format->server_ID).value,(long)(prior_format->server_ID).length);
  lVar2 = (long)(prior_format->server_ID).length;
  memcpy((void *)(lVar2 + (long)__dest),xform_code,s - lVar2);
  *len_p = s;
  return __dest;
}

Assistant:

extern void *
FFScreate_compat_info(FMFormat prior_format, char *xform_code, size_t *len_p)
{
    char *block;
    size_t block_len = strlen(xform_code) + prior_format->server_ID.length +1;
    block = malloc(block_len);

    memcpy(block, prior_format->server_ID.value,
	   prior_format->server_ID.length);
    memcpy(block + prior_format->server_ID.length,
	   xform_code, block_len - prior_format->server_ID.length);
    *len_p = block_len;
    return block;
}